

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O2

string * __thiscall
Component::NiceName_abi_cxx11_(string *__return_storage_ptr__,Component *this,char sub)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  bool bVar1;
  char local_14;
  char local_13;
  allocator local_12;
  allocator local_11;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                          ".");
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"ROOT",&local_11);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(this->root).m_pathname._M_dataplus._M_p + 2,
               &local_12);
    __first._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(__first._M_current + __return_storage_ptr__->_M_string_length),&local_13,
               &local_14);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Component::NiceName(char sub) const {
    if (root.string() == ".") {
        return std::string("ROOT");
    }

    std::string nicename = root.generic_string().c_str() + 2;
    std::replace(nicename.begin(), nicename.end(), '/', sub);
    return nicename;
}